

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_library_interface
          (Impl *this,Value *lib,VkRayTracingPipelineInterfaceCreateInfoKHR **out_info)

{
  bool bVar1;
  uint uVar2;
  VkRayTracingPipelineInterfaceCreateInfoKHR *pVVar3;
  Type pGVar4;
  VkRayTracingPipelineInterfaceCreateInfoKHR *state;
  VkRayTracingPipelineInterfaceCreateInfoKHR **out_info_local;
  Value *lib_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkRayTracingPipelineInterfaceCreateInfoKHR>
                     (&this->allocator);
  pVVar3->sType = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_INTERFACE_CREATE_INFO_KHR;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)lib,"maxPipelineRayPayloadSize");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->maxPipelineRayPayloadSize = uVar2;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)lib,"maxPipelineRayHitAttributeSize");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->maxPipelineRayHitAttributeSize = uVar2;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(lib,"pNext");
  if (bVar1) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)lib,"pNext");
    bVar1 = parse_pnext_chain(this,pGVar4,&pVVar3->pNext,(StateCreatorInterface *)0x0,
                              (DatabaseInterface *)0x0,(Value *)0x0);
    if (!bVar1) {
      return false;
    }
  }
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_library_interface(const Value &lib,
                                                  const VkRayTracingPipelineInterfaceCreateInfoKHR **out_info)
{
	auto *state = allocator.allocate_cleared<VkRayTracingPipelineInterfaceCreateInfoKHR>();

	state->sType = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_INTERFACE_CREATE_INFO_KHR;
	state->maxPipelineRayPayloadSize = lib["maxPipelineRayPayloadSize"].GetUint();
	state->maxPipelineRayHitAttributeSize = lib["maxPipelineRayHitAttributeSize"].GetUint();

	if (lib.HasMember("pNext"))
		if (!parse_pnext_chain(lib["pNext"], &state->pNext))
			return false;

	*out_info = state;
	return true;
}